

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  st_evp_keyex_context_t *ctx_00;
  int iVar1;
  uint8_t *puVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_70;
  size_t local_68;
  uint8_t *local_60;
  size_t local_58;
  int local_4c;
  EVP_PKEY_CTX *pEStack_48;
  int ret;
  EVP_PKEY_CTX *evpctx;
  EVP_PKEY *evppeer;
  st_evp_keyex_context_t *ctx;
  ptls_iovec_t *secret_local;
  int release_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_iovec_t peerkey_local;
  
  ctx_00 = (st_evp_keyex_context_t *)*_ctx;
  evpctx = (EVP_PKEY_CTX *)0x0;
  pEStack_48 = (EVP_PKEY_CTX *)0x0;
  if (secret == (ptls_iovec_t *)0x0) {
    local_4c = 0;
  }
  else {
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_60 = pVar3.base;
    secret->base = local_60;
    local_58 = pVar3.len;
    secret->len = local_58;
    if (peerkey.len == (ctx_00->super).pubkey.len) {
      evpctx = (EVP_PKEY_CTX *)EVP_PKEY_new();
      if ((EVP_PKEY *)evpctx == (EVP_PKEY *)0x0) {
        local_4c = 0x201;
      }
      else {
        iVar1 = EVP_PKEY_copy_parameters((EVP_PKEY *)evpctx,(EVP_PKEY *)ctx_00->privkey);
        if (iVar1 < 1) {
          local_4c = 0x203;
        }
        else {
          iVar1 = EVP_PKEY_set1_encoded_public_key(evpctx,peerkey.base,peerkey.len);
          if (iVar1 < 1) {
            local_4c = 0x203;
          }
          else {
            pEStack_48 = EVP_PKEY_CTX_new((EVP_PKEY *)ctx_00->privkey,(ENGINE *)0x0);
            if (pEStack_48 == (EVP_PKEY_CTX *)0x0) {
              local_4c = 0x203;
            }
            else {
              iVar1 = EVP_PKEY_derive_init(pEStack_48);
              if (iVar1 < 1) {
                local_4c = 0x203;
              }
              else {
                iVar1 = EVP_PKEY_derive_set_peer(pEStack_48,(EVP_PKEY *)evpctx);
                if (iVar1 < 1) {
                  local_4c = 0x203;
                }
                else {
                  iVar1 = EVP_PKEY_derive(pEStack_48,(uchar *)0x0,&secret->len);
                  if (iVar1 < 1) {
                    local_4c = 0x203;
                  }
                  else {
                    puVar2 = (uint8_t *)malloc(secret->len);
                    secret->base = puVar2;
                    if (puVar2 == (uint8_t *)0x0) {
                      local_4c = 0x201;
                    }
                    else {
                      iVar1 = EVP_PKEY_derive(pEStack_48,secret->base,&secret->len);
                      if (iVar1 < 1) {
                        local_4c = 0x203;
                      }
                      else {
                        local_4c = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_4c = 0x33;
    }
  }
  if (pEStack_48 != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_CTX_free(pEStack_48);
  }
  if (evpctx != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)evpctx);
  }
  if (local_4c != 0) {
    free(secret->base);
    pVar3 = ptls_iovec_init((void *)0x0,0);
    local_70 = pVar3.base;
    secret->base = local_70;
    local_68 = pVar3.len;
    secret->len = local_68;
  }
  if (release != 0) {
    evp_keyex_free(ctx_00);
    *_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  return local_4c;
}

Assistant:

static int evp_keyex_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_evp_keyex_context_t *ctx = (void *)*_ctx;
    EVP_PKEY *evppeer = NULL;
    EVP_PKEY_CTX *evpctx = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    *secret = ptls_iovec_init(NULL, 0);

    if (peerkey.len != ctx->super.pubkey.len) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }

#ifdef OPENSSL_IS_BORINGSSL
#define X25519_KEY_SIZE 32
    if (ctx->super.algo->id == PTLS_GROUP_X25519) {
        /* allocate memory to return secret */
        if ((secret->base = malloc(X25519_KEY_SIZE)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        secret->len = X25519_KEY_SIZE;
        /* fetch raw key and derive the secret */
        uint8_t sk_raw[X25519_KEY_SIZE];
        size_t sk_raw_len = sizeof(sk_raw);
        if (EVP_PKEY_get_raw_private_key(ctx->privkey, sk_raw, &sk_raw_len) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        assert(sk_raw_len == sizeof(sk_raw));
        X25519(secret->base, sk_raw, peerkey.base);
        ptls_clear_memory(sk_raw, sizeof(sk_raw));
        /* check bad key */
        static const uint8_t zeros[X25519_KEY_SIZE] = {0};
        if (ptls_mem_equal(secret->base, zeros, X25519_KEY_SIZE)) {
            ret = PTLS_ERROR_INCOMPATIBLE_KEY;
            goto Exit;
        }
        /* success */
        ret = 0;
        goto Exit;
    }
#undef X25519_KEY_SIZE
#endif

    if ((evppeer = EVP_PKEY_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_copy_parameters(evppeer, ctx->privkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_set1_tls_encodedpoint(evppeer, peerkey.base, peerkey.len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((evpctx = EVP_PKEY_CTX_new(ctx->privkey, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_set_peer(evpctx, evppeer) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, NULL, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, secret->base, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    if (evppeer != NULL)
        EVP_PKEY_free(evppeer);
    if (ret != 0) {
        free(secret->base);
        *secret = ptls_iovec_init(NULL, 0);
    }
    if (release) {
        evp_keyex_free(ctx);
        *_ctx = NULL;
    }
    return ret;
}